

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionMultiCond::optimize_conditions
          (InstructionMultiCond *this,PtrPool<Hpipe::Instruction,_32> *inst_pool)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pdVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pRVar6;
  uint i;
  int iVar7;
  long lVar8;
  ulong uVar9;
  mapped_type_conflict *pmVar10;
  Instruction *pIVar11;
  Vec<Hpipe::BranchSet::Range> *__range1;
  uint uVar12;
  char *__filename;
  uint i_1;
  ulong uVar13;
  ulong uVar14;
  Transition *t;
  pointer pRVar15;
  pointer pRVar16;
  pointer pTVar17;
  double dVar18;
  Vec<Hpipe::BranchSet::Range> ranges;
  BranchSet best_bs;
  map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
  nb_ranges;
  _Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> local_860;
  Cond local_848;
  Instruction *inst [256];
  
  if ((this->super_Instruction).op_id != Instruction::cur_op_id) {
    (this->super_Instruction).op_id = Instruction::cur_op_id;
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      inst[lVar8] = (Instruction *)0x0;
    }
    pCVar1 = (this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar17 = (this->super_Instruction).next.
              super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar2 = (this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>.
             super__Vector_base<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar12 = 0; uVar9 = (ulong)uVar12, uVar9 < (ulong)((long)pCVar1 - (long)pCVar2 >> 5);
        uVar12 = uVar12 + 1) {
      for (uVar13 = 0; uVar13 != 0x100; uVar13 = uVar13 + 1) {
        if ((pCVar2[uVar9].p.super__Base_bitset<4UL>._M_w[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
        {
          inst[uVar13] = pTVar17[uVar9].inst;
        }
      }
    }
    ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
    super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar9 = 0; uVar9 != 0x100; uVar9 = uVar9 + 1) {
      if (inst[uVar9] != (Instruction *)0x0) goto LAB_0016c4f4;
    }
    uVar9 = 0x100;
LAB_0016c4f4:
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    uVar13 = uVar9 & 0xffffffff;
    while( true ) {
      uVar14 = uVar13 + 1;
      iVar7 = (int)uVar9;
      if (0xfe < uVar13) break;
      if ((inst[uVar14] != (Instruction *)0x0) && (inst[uVar14] != inst[iVar7])) {
        nb_ranges._M_t._M_impl._4_4_ = SUB84(uVar14,0);
        nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        nb_ranges._M_t._M_impl._0_4_ = iVar7;
        nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = inst[iVar7];
        std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
        emplace_back<Hpipe::BranchSet::Range>
                  (&ranges.
                    super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
                   (Range *)&nb_ranges);
        nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        uVar9 = uVar14 & 0xffffffff;
      }
      pdVar3 = (this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((this->super_Instruction).freq.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish == pdVar3) {
        dVar18 = 0.0;
      }
      else {
        dVar18 = pdVar3[uVar14];
      }
      nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           ((double)nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left + dVar18);
      uVar13 = uVar14;
    }
    if (iVar7 != 0x100) {
      nb_ranges._M_t._M_impl._4_4_ = 0x100;
      nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = inst[iVar7];
      nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      nb_ranges._M_t._M_impl._0_4_ = iVar7;
      std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
      emplace_back<Hpipe::BranchSet::Range>
                (&ranges.
                  super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
                 (Range *)&nb_ranges);
    }
    pRVar16 = ranges.super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
              .super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header;
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         nb_ranges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pRVar15 = ranges.
                   super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pRVar6 = ranges.
                 super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
                 super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pRVar15 != pRVar16;
        pRVar15 = pRVar15 + 1) {
      pmVar10 = std::
                map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                ::operator[](&nb_ranges,&pRVar15->inst);
      *pmVar10 = *pmVar10 + 1.0;
    }
    for (pRVar16 = ranges.
                   super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>.
                   super__Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar16 != pRVar6;
        pRVar16 = pRVar16 + 1) {
      pmVar10 = std::
                map<Hpipe::Instruction_*,_double,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
                ::operator[](&nb_ranges,&pRVar16->inst);
      pRVar16->freq = 0.001 / *pmVar10 + pRVar16->freq;
    }
    std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::vector
              ((vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> *)
               &local_860,
               &ranges.
                super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>);
    BranchSet::BranchSet(&best_bs,(Vec<Hpipe::BranchSet::Range> *)&local_860);
    std::_Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
    ~_Vector_base(&local_860);
    Cond::Cond(&local_848);
    pIVar11 = InstructionCond::make_cond
                        (best_bs.root.data,inst_pool,&local_848,(this->super_Instruction).in_a_cycle
                         ,(this->super_Instruction).mark,this->off_data);
    Instruction::repl_in_preds(&this->super_Instruction,pIVar11);
    pTVar4 = (this->super_Instruction).next.
             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar17 = (this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start; pTVar17 != pTVar4; pTVar17 = pTVar17 + 1) {
      pIVar11 = pTVar17->inst;
      pTVar5 = (pIVar11->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar12 = 0; __filename = (char *)(ulong)uVar12,
          __filename <
          (char *)(((long)(pIVar11->prev).
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x28);
          uVar12 = uVar12 + 1) {
        if ((InstructionMultiCond *)pTVar5[(long)__filename].inst == this) {
          Vec<Hpipe::Transition>::remove(&pIVar11->prev,__filename);
          break;
        }
      }
    }
    pTVar4 = (this->super_Instruction).next.
             super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar17 = (this->super_Instruction).next.
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_start; pTVar17 != pTVar4; pTVar17 = pTVar17 + 1) {
      (*pTVar17->inst->_vptr_Instruction[0xe])(pTVar17->inst,inst_pool);
    }
    AutoPtr<Hpipe::BranchSet::Node,_Hpipe::Delete>::~AutoPtr(&best_bs.root);
    std::
    _Rb_tree<Hpipe::Instruction_*,_std::pair<Hpipe::Instruction_*const,_double>,_std::_Select1st<std::pair<Hpipe::Instruction_*const,_double>_>,_std::less<Hpipe::Instruction_*>,_std::allocator<std::pair<Hpipe::Instruction_*const,_double>_>_>
    ::~_Rb_tree(&nb_ranges._M_t);
    std::_Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::
    ~_Vector_base((_Vector_base<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_> *
                  )&ranges);
  }
  return;
}

Assistant:

void InstructionMultiCond::optimize_conditions( PtrPool<Instruction> &inst_pool ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    // char => instruction
    Instruction *inst[ 256 ];
    for( unsigned i = 0; i < 256; ++i )
        inst[ i ] = 0;
    for( unsigned n = 0; n < conds.size(); ++n )
        for( unsigned i = 0; i < 256; ++i )
            if ( conds[ n ][ i ] )
                inst[ i ] = next[ n ].inst;

    // input for BranchSet
    Vec<BranchSet::Range> ranges;
    double cum_freq = 0;
    int o = 0;
    while ( o < 256 and not inst[ o ] )
        ++o;
    for( int i = o + 1; i < 256; ++i ) {
        if ( inst[ i ] and inst[ i ] != inst[ o ] ) {
            ranges.emplace_back( BranchSet::Range{ o, i, inst[ o ], nullptr, cum_freq } );
            cum_freq = 0;
            o = i;
        }
        cum_freq += freq.size() ? freq[ i ] : 0;
    }
    if ( o != 256 )
        ranges.emplace_back( BranchSet::Range{ o, 256, inst[ o ], nullptr, cum_freq } );

    // to avoid freq 0
    std::map<Instruction *,double> nb_ranges;
    for( BranchSet::Range &range : ranges )
        ++nb_ranges[ range.inst ];
    for( BranchSet::Range &range : ranges )
        range.freq += 1e-3 / nb_ranges[ range.inst ];

    // if succession of cond seams to be a better solution, use them
    BranchSet best_bs( ranges );
    repl_in_preds( InstructionCond::make_cond( best_bs.root.ptr(), inst_pool, {}, in_a_cycle, mark, off_data ) );
    for( Transition &t : next )
        t.inst->prev.remove_first_checking( [&]( Transition &p ) { return p.inst == this; } );

    // following conditions
    for( Transition &t : next )
        t.inst->optimize_conditions( inst_pool );
}